

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_container_printf(bitset_container_t *v)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  char *__format;
  uint uVar4;
  int i;
  long lVar5;
  
  putchar(0x7b);
  bVar3 = true;
  uVar4 = 0;
  for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 1) {
    for (uVar2 = v->words[lVar5]; uVar2 != 0; uVar2 = uVar2 & uVar2 - 1) {
      lVar1 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      __format = ",%u";
      if (bVar3) {
        __format = "%u";
      }
      bVar3 = false;
      printf(__format,(ulong)((uint)lVar1 | uVar4));
    }
    uVar4 = uVar4 + 0x40;
  }
  putchar(0x7d);
  return;
}

Assistant:

void bitset_container_printf(const bitset_container_t * v) {
	printf("{");
	uint32_t base = 0;
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = roaring_trailing_zeroes(w);
			if(iamfirst) {// predicted to be false
				printf("%u",base + r);
				iamfirst = false;
			} else {
				printf(",%u",base + r);
			}
			w ^= t;
		}
		base += 64;
	}
	printf("}");
}